

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

ostream * Eigen::internal::print_matrix<Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>
                    (ostream *s,Matrix<std::complex<double>,__1,_1,_0,__1,_1> *_m,IOFormat *fmt)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Index i;
  long lVar8;
  long local_200;
  undefined8 local_1f8;
  string local_1d8 [8];
  long local_1d0;
  stringstream sstr;
  ostream local_1a8 [376];
  
  lVar7 = (_m->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>).
          m_storage.m_rows;
  if (lVar7 == 0) {
    poVar3 = std::operator<<(s,(string *)fmt);
    std::operator<<(poVar3,(string *)&fmt->matSuffix);
    return s;
  }
  iVar1 = fmt->precision;
  lVar5 = (long)iVar1;
  if (lVar5 == -2) {
    lVar5 = 0x10;
  }
  else if ((iVar1 == -1) || (iVar1 == 0)) {
    bVar2 = true;
    local_1f8 = 0;
    goto LAB_0014ddab;
  }
  local_1f8 = *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8);
  *(long *)(s + *(long *)(*(long *)s + -0x18) + 8) = lVar5;
  bVar2 = false;
LAB_0014ddab:
  if ((fmt->flags & 1) == 0) {
    bVar4 = true;
    lVar5 = 0;
    local_200 = 0;
    while (bVar4) {
      lVar8 = 0;
      for (lVar6 = 0; lVar6 < lVar7; lVar6 = lVar6 + 1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&sstr);
        std::ios::copyfmt((ios *)((stringstream *)&sstr + *(long *)(_sstr + -0x18)));
        std::operator<<(local_1a8,
                        (complex *)
                        ((_m->
                         super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
                         ).m_storage.m_data
                         [(_m->
                          super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
                          ).m_storage.m_rows * local_200]._M_value + lVar8));
        std::__cxx11::stringbuf::str();
        if (lVar5 <= local_1d0) {
          lVar5 = local_1d0;
        }
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&sstr);
        lVar7 = (_m->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows;
        lVar8 = lVar8 + 0x10;
      }
      bVar4 = false;
      local_200 = 1;
    }
  }
  else {
    lVar5 = 0;
  }
  std::operator<<(s,(string *)fmt);
  lVar7 = 0;
  for (lVar6 = 0;
      lVar6 < (_m->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>).
              m_storage.m_rows; lVar6 = lVar6 + 1) {
    if (lVar6 != 0) {
      std::operator<<(s,(string *)&fmt->rowSpacer);
    }
    std::operator<<(s,(string *)&fmt->rowPrefix);
    if (lVar5 != 0) {
      *(long *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = lVar5;
    }
    std::operator<<(s,(complex *)
                      (((_m->
                        super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
                        ).m_storage.m_data)->_M_value + lVar7));
    std::operator<<(s,(string *)&fmt->rowSuffix);
    if (lVar6 < (_m->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows + -1) {
      std::operator<<(s,(string *)&fmt->rowSeparator);
    }
    lVar7 = lVar7 + 0x10;
  }
  std::operator<<(s,(string *)&fmt->matSuffix);
  if (!bVar2) {
    *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8) = local_1f8;
  }
  return s;
}

Assistant:

std::ostream & print_matrix(std::ostream & s, const Derived& _m, const IOFormat& fmt)
{
  if(_m.size() == 0)
  {
    s << fmt.matPrefix << fmt.matSuffix;
    return s;
  }
  
  typename Derived::Nested m = _m;
  typedef typename Derived::Scalar Scalar;
  typedef typename Derived::Index Index;

  Index width = 0;

  std::streamsize explicit_precision;
  if(fmt.precision == StreamPrecision)
  {
    explicit_precision = 0;
  }
  else if(fmt.precision == FullPrecision)
  {
    if (NumTraits<Scalar>::IsInteger)
    {
      explicit_precision = 0;
    }
    else
    {
      explicit_precision = significant_decimals_impl<Scalar>::run();
    }
  }
  else
  {
    explicit_precision = fmt.precision;
  }

  std::streamsize old_precision = 0;
  if(explicit_precision) old_precision = s.precision(explicit_precision);

  bool align_cols = !(fmt.flags & DontAlignCols);
  if(align_cols)
  {
    // compute the largest width
    for(Index j = 0; j < m.cols(); ++j)
      for(Index i = 0; i < m.rows(); ++i)
      {
        std::stringstream sstr;
        sstr.copyfmt(s);
        sstr << m.coeff(i,j);
        width = std::max<Index>(width, Index(sstr.str().length()));
      }
  }
  s << fmt.matPrefix;
  for(Index i = 0; i < m.rows(); ++i)
  {
    if (i)
      s << fmt.rowSpacer;
    s << fmt.rowPrefix;
    if(width) s.width(width);
    s << m.coeff(i, 0);
    for(Index j = 1; j < m.cols(); ++j)
    {
      s << fmt.coeffSeparator;
      if (width) s.width(width);
      s << m.coeff(i, j);
    }
    s << fmt.rowSuffix;
    if( i < m.rows() - 1)
      s << fmt.rowSeparator;
  }
  s << fmt.matSuffix;
  if(explicit_precision) s.precision(old_precision);
  return s;
}